

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckForStyleAttribute(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  Bool BVar1;
  AttVal *av;
  Node **ppNVar2;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    av = prvTidyAttrGetById(node,TidyAttr_STYLE);
    BVar1 = hasValue(av);
    if (BVar1 != no) {
      prvTidyReportAccessError(doc,node,0x2d2);
    }
  }
  ppNVar2 = &node->content;
  while (node_00 = *ppNVar2, node_00 != (Node *)0x0) {
    CheckForStyleAttribute(doc,node_00);
    ppNVar2 = &node_00->next;
  }
  return;
}

Assistant:

static void CheckForStyleAttribute( TidyDocImpl* doc, Node* node )
{
    Node* content;
    if (Level1_Enabled( doc ))
    {
        /* Must not contain 'STYLE' attribute */
        AttVal* style = attrGetSTYLE( node );
        if ( hasValue(style) )
        {
            TY_(ReportAccessError)( doc, node, STYLESHEETS_REQUIRE_TESTING_STYLE_ATTR );
        }
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
        CheckForStyleAttribute( doc, content );
}